

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form3_Sobel(SobelForm3 Sobel)

{
  bool bVar1;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  uint local_78;
  uint local_74;
  uint32_t local_70;
  uint32_t local_6c;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_40,0,0,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  Unit_Test::generateRoi(&local_40,&local_6c,&local_70,&local_74,&local_78);
  bVar1 = true;
  if (2 < local_78 && 2 < local_74) {
    (*Sobel)(&local_68,&local_40,local_6c,local_70,local_74,local_78);
    bVar1 = Unit_Test::equalSize(&local_68,local_74,local_78);
    if (bVar1) {
      bVar1 = Unit_Test::verifyImage(&local_68,'\0');
    }
    else {
      bVar1 = false;
    }
    local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  }
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  return bVar1;
}

Assistant:

bool form3_Sobel(SobelForm3 Sobel)
    {
        const PenguinV_Image::Image input = uniformImage();

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );
        if ( (roiWidth < 3) || (roiHeight < 3) )
            return true;

        const PenguinV_Image::Image output = Sobel( input, roiX, roiY, roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, 0u );
    }